

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImDrawListSharedData::ImDrawListSharedData(ImDrawListSharedData *this)

{
  int i;
  long lVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [32];
  
  (this->TexUvWhitePixel).x = 0.0;
  (this->TexUvWhitePixel).y = 0.0;
  (this->ClipRectFullscreen).x = 0.0;
  (this->ClipRectFullscreen).y = 0.0;
  (this->ClipRectFullscreen).z = 0.0;
  (this->ClipRectFullscreen).w = 0.0;
  *(undefined1 (*) [32])(this->ArcFastVtx + 8) = ZEXT432(0) << 0x40;
  *(undefined1 (*) [32])(this->ArcFastVtx + 4) = ZEXT432(0) << 0x40;
  auVar4 = ZEXT432(0) << 0x40;
  *(undefined1 (*) [32])this->ArcFastVtx = auVar4;
  *(undefined1 (*) [32])(this->CircleSegmentCounts + 0x10) = auVar4;
  *(undefined1 (*) [32])(this->CircleSegmentCounts + 0x28) = auVar4;
  *(undefined1 (*) [32])(this->ArcFastVtx + 10) = auVar4;
  auVar4 = ZEXT432(0) << 0x40;
  *(undefined1 (*) [32])(this->ArcFastVtx + 6) = auVar4;
  *(undefined1 (*) [32])(this->ArcFastVtx + 2) = auVar4;
  *(undefined1 (*) [32])&(this->ClipRectFullscreen).y = auVar4;
  (this->TexUvWhitePixel).x = (float)(int)auVar4._0_8_;
  (this->TexUvWhitePixel).y = (float)(int)((ulong)auVar4._0_8_ >> 0x20);
  this->Font = (ImFont *)auVar4._8_8_;
  this->FontSize = (float)auVar4._16_4_;
  this->CurveTessellationTol = (float)auVar4._20_4_;
  this->CircleSegmentMaxError = (float)auVar4._24_4_;
  (this->ClipRectFullscreen).x = (float)auVar4._28_4_;
  lVar1 = 0;
  do {
    fVar2 = (((float)(int)lVar1 + (float)(int)lVar1) * 3.1415927) / 12.0;
    fVar3 = cosf(fVar2);
    fVar2 = sinf(fVar2);
    this->ArcFastVtx[lVar1].x = fVar3;
    this->ArcFastVtx[lVar1].y = fVar2;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0xc);
  return;
}

Assistant:

ImDrawListSharedData::ImDrawListSharedData()
{
    memset(this, 0, sizeof(*this));
    for (int i = 0; i < IM_ARRAYSIZE(ArcFastVtx); i++)
    {
        const float a = ((float)i * 2 * IM_PI) / (float)IM_ARRAYSIZE(ArcFastVtx);
        ArcFastVtx[i] = ImVec2(ImCos(a), ImSin(a));
    }
}